

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O0

void file_free(file_conflict *file)

{
  heap_data *phVar1;
  heap_data *next_heap;
  heap_data *heap;
  file_conflict *file_local;
  
  next_heap = (file->xattr).first;
  while (next_heap != (heap_data *)0x0) {
    phVar1 = next_heap->next;
    free(next_heap);
    next_heap = phVar1;
  }
  archive_string_free(&file->parentdir);
  archive_string_free(&file->basename);
  archive_string_free(&file->symlink);
  archive_string_free(&file->script);
  archive_entry_free(file->entry);
  free(file);
  return;
}

Assistant:

static int
file_free(struct archive *a, void *client_data)
{
	struct write_file_data	*mine = (struct write_file_data *)client_data;

	(void)a; /* UNUSED */

	if (mine == NULL)
		return (ARCHIVE_OK);

	archive_mstring_clean(&mine->filename);
	free(mine);
	return (ARCHIVE_OK);
}